

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivisionExpression.cpp
# Opt level: O0

BaseExpressionPtr __thiscall
Kandinsky::DivisionExpression::derivative(DivisionExpression *this,VariableExpressionPtr *variable)

{
  element_type *peVar1;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  BaseExpressionPtr BVar2;
  shared_ptr<Kandinsky::BaseExpression> *unaff_retaddr;
  shared_ptr<Kandinsky::BaseExpression> *in_stack_00000008;
  BaseExpressionPtr arg2Derivative;
  Expression *in_stack_ffffffffffffff08;
  undefined1 local_d0 [104];
  undefined1 local_68 [8];
  shared_ptr<Kandinsky::BaseExpression> *in_stack_ffffffffffffffa0;
  Expression *in_stack_ffffffffffffffa8;
  Expression *in_stack_ffffffffffffffd0;
  Expression *in_stack_ffffffffffffffd8;
  
  peVar1 = std::
           __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x12b772);
  (*peVar1->_vptr_BaseExpression[1])(&stack0xffffffffffffffd8,peVar1,in_RDX);
  peVar1 = std::
           __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x12b79c);
  (*peVar1->_vptr_BaseExpression[1])(local_68,peVar1,in_RDX);
  operator/<std::shared_ptr<Kandinsky::BaseExpression>,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            ((shared_ptr<Kandinsky::BaseExpression> *)in_stack_ffffffffffffffa8,
             in_stack_ffffffffffffffa0);
  peVar1 = std::
           __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x12b7f4);
  (*peVar1->_vptr_BaseExpression[1])(local_d0,peVar1,in_RDX);
  operator*<std::shared_ptr<Kandinsky::BaseExpression>,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (in_stack_00000008,unaff_retaddr);
  operator/<Kandinsky::Expression,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  operator/<Kandinsky::Expression,_std::shared_ptr<Kandinsky::BaseExpression>,_nullptr>
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  operator-<Kandinsky::Expression,_Kandinsky::Expression,_nullptr>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  BaseExpression::makePtr<Kandinsky::Expression>(in_stack_ffffffffffffff08);
  Expression::~Expression((Expression *)0x12b896);
  Expression::~Expression((Expression *)0x12b8a0);
  Expression::~Expression((Expression *)0x12b8aa);
  Expression::~Expression((Expression *)0x12b8b4);
  std::shared_ptr<Kandinsky::BaseExpression>::~shared_ptr
            ((shared_ptr<Kandinsky::BaseExpression> *)0x12b8be);
  Expression::~Expression((Expression *)0x12b8cb);
  std::shared_ptr<Kandinsky::BaseExpression>::~shared_ptr
            ((shared_ptr<Kandinsky::BaseExpression> *)0x12b8d8);
  std::shared_ptr<Kandinsky::BaseExpression>::~shared_ptr
            ((shared_ptr<Kandinsky::BaseExpression> *)0x12b8e5);
  BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (BaseExpressionPtr)
         BVar2.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

BaseExpressionPtr DivisionExpression::derivative(const VariableExpressionPtr& variable) const
    {
        BaseExpressionPtr arg2Derivative = m_arg2->derivative(variable);
        return makePtr(m_arg1->derivative(variable) / m_arg2 -
                m_arg1 * m_arg2->derivative(variable) / m_arg2 / m_arg2);
    }